

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

CAmount AmountFromValue(UniValue *value,int decimals)

{
  bool bVar1;
  UniValue *pUVar2;
  long in_FS_OFFSET;
  string_view val;
  allocator<char> local_49;
  CAmount amount;
  string local_40;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (value->typ - VSTR < 2) {
    val._M_str = (value->val)._M_dataplus._M_p;
    val._M_len = (value->val)._M_string_length;
    bVar1 = ParseFixedPoint(val,decimals,&amount);
    if (bVar1) {
      if ((ulong)amount < 0x775f05a074001) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return amount;
        }
      }
      else {
        pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_40,"Amount out of range",&local_49);
        JSONRPCError(pUVar2,-3,&local_40);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
        }
      }
    }
    else {
      pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"Invalid amount",&local_49);
      JSONRPCError(pUVar2,-3,&local_40);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
        __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
      }
    }
  }
  else {
    pUVar2 = (UniValue *)__cxa_allocate_exception(0x58);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"Amount is not a number or string",(allocator<char> *)&amount);
    JSONRPCError(pUVar2,-3,&local_40);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      __cxa_throw(pUVar2,&UniValue::typeinfo,UniValue::~UniValue);
    }
  }
  __stack_chk_fail();
}

Assistant:

CAmount AmountFromValue(const UniValue& value, int decimals)
{
    if (!value.isNum() && !value.isStr())
        throw JSONRPCError(RPC_TYPE_ERROR, "Amount is not a number or string");
    CAmount amount;
    if (!ParseFixedPoint(value.getValStr(), decimals, &amount))
        throw JSONRPCError(RPC_TYPE_ERROR, "Invalid amount");
    if (!MoneyRange(amount))
        throw JSONRPCError(RPC_TYPE_ERROR, "Amount out of range");
    return amount;
}